

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugNames::NameIndex::dumpCUs(NameIndex *this,ScopedPrinter *W)

{
  raw_ostream *this_00;
  unsigned_long *in_R8;
  uint64_t local_70;
  format_object<unsigned_int,_unsigned_long> local_68;
  uint local_34;
  undefined1 auStack_30 [4];
  uint32_t CU;
  DelimitedScope<_[_,__]_> local_20;
  ListScope CUScope;
  ScopedPrinter *W_local;
  NameIndex *this_local;
  
  CUScope.W = W;
  StringRef::StringRef((StringRef *)auStack_30,"Compilation Unit offsets");
  DelimitedScope<'[',_']'>::DelimitedScope(&local_20,W,_auStack_30);
  for (local_34 = 0; local_34 < (this->Hdr).super_HeaderPOD.CompUnitCount; local_34 = local_34 + 1)
  {
    this_00 = ScopedPrinter::startLine(CUScope.W);
    local_70 = getCUOffset(this,local_34);
    format<unsigned_int,unsigned_long>
              (&local_68,(llvm *)"CU[%u]: 0x%08lx\n",(char *)&local_34,(uint *)&local_70,in_R8);
    raw_ostream::operator<<(this_00,&local_68.super_format_object_base);
  }
  DelimitedScope<'[',_']'>::~DelimitedScope(&local_20);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpCUs(ScopedPrinter &W) const {
  ListScope CUScope(W, "Compilation Unit offsets");
  for (uint32_t CU = 0; CU < Hdr.CompUnitCount; ++CU)
    W.startLine() << format("CU[%u]: 0x%08" PRIx64 "\n", CU, getCUOffset(CU));
}